

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_vasprintf(char **strp,char *format,__va_list_tag *ap)

{
  int iVar1;
  char *pcVar2;
  va_list apc;
  
  if (strp != (char **)0x0) {
    apc[0].reg_save_area = ap->reg_save_area;
    apc[0].gp_offset = ap->gp_offset;
    apc[0].fp_offset = ap->fp_offset;
    apc[0].overflow_arg_area = ap->overflow_arg_area;
    iVar1 = _vscprintf(format,apc);
    if (iVar1 == 0) {
      pcVar2 = _cargo_strdup("");
      *strp = pcVar2;
      iVar1 = 0;
    }
    else if (-1 < iVar1) {
      pcVar2 = (char *)_cargo_malloc((ulong)(iVar1 + 1));
      *strp = pcVar2;
      if (pcVar2 == (char *)0x0) {
        iVar1 = -1;
      }
      else {
        iVar1 = vsprintf(pcVar2,format,ap);
      }
    }
    return iVar1;
  }
  __assert_fail("strp",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1b3,"int cargo_vasprintf(char **, const char *, struct __va_list_tag *)");
}

Assistant:

int cargo_vasprintf(char **strp, const char *format, va_list ap)
{
    int count;
    va_list apc;
    assert(strp);

    // Find out how long the resulting string is
    va_copy(apc, ap);
    count = _vscprintf(format, apc);
    va_end(apc);

    if (count == 0)
    {
        *strp = _cargo_strdup("");
        return 0;
    }
    else if (count < 0)
    {
        // Something went wrong, so return the error code (probably still requires checking of "errno" though)
        return count;
    }

    // Allocate memory for our string
    if (!(*strp = _cargo_malloc(count + 1)))
    {
        return -1;
    }

    // Do the actual printing into our newly created string
    return vsprintf(*strp, format, ap);
}